

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::container_internal::
raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
::dealloc(raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
          *this)

{
  size_t sVar1;
  slot_type *m;
  allocator_type *alloc;
  CommonFields *pCVar2;
  void *p;
  HashtablezInfoHandle local_11;
  raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
  *local_10;
  raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>,_absl::container_internal::StringHash,_absl::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::CommandLineFlag_*>_>_>
  *this_local;
  
  local_10 = this;
  sVar1 = capacity(this);
  if (sVar1 != 0) {
    m = slot_array(this);
    sVar1 = capacity(this);
    SanitizerUnpoisonMemoryRegion(m,sVar1 * 0x18);
    infoz(this);
    HashtablezInfoHandle::Unregister(&local_11);
    alloc = alloc_ref(this);
    pCVar2 = common(this);
    p = CommonFields::backing_array_start(pCVar2);
    pCVar2 = common(this);
    sVar1 = CommonFields::alloc_size(pCVar2,0x18,8);
    Deallocate<8ul,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::CommandLineFlag*>>>
              (alloc,p,sVar1);
    return;
  }
  __assert_fail("capacity() != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xda3,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>]"
               );
}

Assistant:

inline void dealloc() {
    assert(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }